

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffm_score.cc
# Opt level: O3

void __thiscall
xLearn::FFMScore::calc_grad_sgd(FFMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  uint uVar4;
  real_t *prVar5;
  float fVar6;
  pointer pNVar7;
  uint uVar8;
  ulong uVar9;
  pointer pNVar10;
  int iVar11;
  uint uVar12;
  pointer pNVar13;
  ulong uVar14;
  ulong uVar15;
  pointer pNVar16;
  ulong uVar17;
  ulong uVar18;
  pointer pNVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar22 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar27 [16];
  
  auVar26 = in_ZMM4._0_16_;
  auVar23._4_60_ = in_register_00001244;
  auVar23._0_4_ = norm;
  auVar22._4_60_ = in_register_00001204;
  auVar22._0_4_ = pg;
  auVar21 = auVar22._0_16_;
  if (norm < 0.0) {
    fVar20 = sqrtf(norm);
    auVar21 = ZEXT416((uint)pg);
    auVar23 = ZEXT464((uint)norm);
  }
  else {
    auVar24 = vsqrtss_avx(auVar23._0_16_,auVar23._0_16_);
    fVar20 = auVar24._0_4_;
  }
  uVar3 = model->num_feat_;
  uVar4 = model->num_field_;
  pNVar7 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pNVar10 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (pNVar7 != pNVar10) {
    prVar5 = model->param_w_;
    pNVar13 = pNVar7;
    do {
      uVar12 = pNVar13->feat_id;
      if (uVar12 < uVar3) {
        auVar25 = ZEXT416((uint)prVar5[uVar12]);
        auVar24 = vfmadd231ss_fma(ZEXT416((uint)(fVar20 * auVar21._0_4_ * pNVar13->feat_val)),
                                  auVar25,ZEXT416((uint)(this->super_Score).regu_lambda_));
        auVar24 = vfnmadd132ss_fma(auVar24,auVar25,ZEXT416((uint)(this->super_Score).learning_rate_)
                                  );
        prVar5[uVar12] = auVar24._0_4_;
      }
      pNVar13 = pNVar13 + 1;
    } while (pNVar13 != pNVar10);
  }
  auVar24 = vfnmadd213ss_fma(ZEXT416((uint)(this->super_Score).learning_rate_),auVar21,
                             ZEXT416((uint)*model->param_b_));
  *model->param_b_ = auVar24._0_4_;
  if (pNVar7 != pNVar10) {
    auVar25 = vcvtusi2ss_avx512f(auVar26,model->aux_size_);
    fVar20 = (this->super_Score).regu_lambda_;
    prVar5 = model->param_v_;
    auVar24 = vcvtusi2ss_avx512f(auVar26,model->num_K_);
    auVar24 = ZEXT416((uint)(auVar24._0_4_ * 0.25));
    auVar24 = vroundss_avx(auVar24,auVar24,10);
    iVar11 = vcvttss2usi_avx512f(auVar24);
    auVar26 = vcvtusi2ss_avx512f(auVar26,iVar11 << 2);
    uVar12 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar25._0_4_ * auVar26._0_4_)));
    iVar11 = vcvttss2usi_avx512f(ZEXT416((uint)(auVar25._0_4_ * 4.0)));
    fVar1 = (this->super_Score).learning_rate_;
    do {
      if ((pNVar7->field_id < uVar4 && pNVar7->feat_id < uVar3) && (pNVar7 + 1 != pNVar10)) {
        fVar2 = pNVar7->feat_val;
        uVar15 = (ulong)(pNVar7->feat_id * uVar4 * uVar12);
        uVar18 = (ulong)(pNVar7->field_id * uVar12);
        pNVar13 = pNVar7 + 1;
        pNVar19 = pNVar7;
        do {
          pNVar16 = pNVar13;
          if ((pNVar19[1].field_id < uVar4 && pNVar19[1].feat_id < uVar3) && (uVar12 != 0)) {
            uVar17 = (ulong)(pNVar19[1].feat_id * uVar4 * uVar12);
            uVar9 = (ulong)(pNVar19[1].field_id * uVar12);
            uVar8 = 0;
            fVar6 = auVar21._0_4_ * fVar2 * pNVar19[1].feat_val * auVar23._0_4_;
            do {
              uVar14 = (ulong)uVar8;
              auVar26 = *(undefined1 (*) [16])(prVar5 + uVar15 + uVar9 + uVar14);
              auVar24 = *(undefined1 (*) [16])(prVar5 + uVar18 + uVar17 + uVar14);
              uVar8 = uVar8 + iVar11;
              auVar25._0_4_ = fVar1 * (fVar20 * auVar26._0_4_ + fVar6 * auVar24._0_4_);
              auVar25._4_4_ = fVar1 * (fVar20 * auVar26._4_4_ + fVar6 * auVar24._4_4_);
              auVar25._8_4_ = fVar1 * (fVar20 * auVar26._8_4_ + fVar6 * auVar24._8_4_);
              auVar25._12_4_ = fVar1 * (fVar20 * auVar26._12_4_ + fVar6 * auVar24._12_4_);
              auVar27._0_4_ = fVar1 * (fVar6 * auVar26._0_4_ + fVar20 * auVar24._0_4_);
              auVar27._4_4_ = fVar1 * (fVar6 * auVar26._4_4_ + fVar20 * auVar24._4_4_);
              auVar27._8_4_ = fVar1 * (fVar6 * auVar26._8_4_ + fVar20 * auVar24._8_4_);
              auVar27._12_4_ = fVar1 * (fVar6 * auVar26._12_4_ + fVar20 * auVar24._12_4_);
              auVar26 = vsubps_avx(auVar26,auVar25);
              auVar24 = vsubps_avx(auVar24,auVar27);
              *(undefined1 (*) [16])(prVar5 + uVar15 + uVar9 + uVar14) = auVar26;
              *(undefined1 (*) [16])(prVar5 + uVar18 + uVar17 + uVar14) = auVar24;
            } while (uVar8 < uVar12);
            pNVar10 = (row->super__Vector_base<xLearn::Node,_std::allocator<xLearn::Node>_>)._M_impl
                      .super__Vector_impl_data._M_finish;
          }
          pNVar13 = pNVar16 + 1;
          pNVar19 = pNVar16;
        } while (pNVar13 != pNVar10);
      }
      pNVar7 = pNVar7 + 1;
    } while (pNVar7 != pNVar10);
  }
  return;
}

Assistant:

void FFMScore::calc_grad_sgd(const SparseRow* row,
                             Model& model,
                             real_t pg,
                             real_t norm) {
  /*********************************************************
   *  linear term and bias term                            *
   *********************************************************/
  real_t sqrt_norm = sqrt(norm);
  real_t *w = model.GetParameter_w();
  index_t num_feat = model.GetNumFeature();
  index_t num_field = model.GetNumField();
  for (SparseRow::const_iterator iter = row->begin();
       iter != row->end(); ++iter) {
    index_t feat_id = iter->feat_id;
    // To avoid unseen feature
    if (feat_id >= num_feat) continue;
    real_t &wl = w[feat_id];
    real_t g = regu_lambda_*wl+pg*iter->feat_val*sqrt_norm;
    wl -= (learning_rate_ * g);
  }
  // bias
  w = model.GetParameter_b();
  real_t &wb = w[0];
  real_t g = pg;
  wb -= (learning_rate_ * g);
  /*********************************************************
   *  latent factor                                        *
   *********************************************************/
  index_t align0 = model.GetAuxiliarySize() * model.get_aligned_k();
  index_t align1 = model.GetNumField() * align0;
  index_t align = kAlign * model.GetAuxiliarySize();
  w = model.GetParameter_v();
  __m128 XMMpg = _mm_set1_ps(pg);
  __m128 XMMlr = _mm_set1_ps(learning_rate_);
  __m128 XMMlamb = _mm_set1_ps(regu_lambda_);
  for (SparseRow::const_iterator iter_i = row->begin();
       iter_i != row->end(); ++iter_i) {
    index_t j1 = iter_i->feat_id;
    index_t f1 = iter_i->field_id;
    // To avoid unseen feature
    if (j1 >= num_feat || f1 >= num_field) continue;
    real_t v1 = iter_i->feat_val;
    for (SparseRow::const_iterator iter_j = iter_i+1;
         iter_j != row->end(); ++iter_j) {
      index_t j2 = iter_j->feat_id;
      index_t f2 = iter_j->field_id;
      // To avoid unseen feature
      if (j2 >= num_feat || f2 >= num_field) continue;
      real_t v2 = iter_j->feat_val;
      real_t* w1_base = w + j1*align1 + f2*align0;
      real_t* w2_base = w + j2*align1 + f1*align0;
      __m128 XMMv = _mm_set1_ps(v1*v2*norm);
      __m128 XMMpgv = _mm_mul_ps(XMMv, XMMpg);
      for (index_t d = 0; d < align0; d += align) {
        real_t *w1 = w1_base + d;
        real_t *w2 = w2_base + d;
        __m128 XMMw1 = _mm_load_ps(w1);
        __m128 XMMw2 = _mm_load_ps(w2);
        __m128 XMMg1 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw1),
                       _mm_mul_ps(XMMpgv, XMMw2));
        __m128 XMMg2 = _mm_add_ps(
                       _mm_mul_ps(XMMlamb, XMMw2),
                       _mm_mul_ps(XMMpgv, XMMw1));
        XMMw1 = _mm_sub_ps(XMMw1, _mm_mul_ps(XMMlr, XMMg1));
        XMMw2 = _mm_sub_ps(XMMw2, _mm_mul_ps(XMMlr, XMMg2));
        _mm_store_ps(w1, XMMw1);
        _mm_store_ps(w2, XMMw2);
      }
    }
  }

}